

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fct_junit_logger_t * fct_junit_logger_new(void)

{
  fct_junit_logger_t *logger;
  
  logger = (fct_junit_logger_t *)calloc(1,0x90);
  if (logger == (fct_junit_logger_t *)0x0) {
    logger = (fct_junit_logger_t *)0x0;
  }
  else {
    fct_logger__init((fct_logger_i *)logger);
    (((fct_logger_i *)logger)->vtable).on_test_suite_start = fct_junit_logger__on_test_suite_start;
    (((fct_logger_i *)logger)->vtable).on_test_suite_end = fct_junit_logger__on_test_suite_end;
    (((fct_logger_i *)logger)->vtable).on_fctx_start = fct_junit_logger__on_fct_start;
    (((fct_logger_i *)logger)->vtable).on_fctx_end = fct_junit_logger__on_fctx_end;
    (((fct_logger_i *)logger)->vtable).on_delete = fct_junit_logger__on_delete;
  }
  return logger;
}

Assistant:

fct_junit_logger_t *
fct_junit_logger_new(void)
{
    fct_junit_logger_t *logger =
        (fct_junit_logger_t *)calloc(1, sizeof(fct_junit_logger_t));
    if ( logger == NULL )
    {
        return NULL;
    }
    fct_logger__init((fct_logger_i*)logger);
    logger->vtable.on_test_suite_start = fct_junit_logger__on_test_suite_start;
    logger->vtable.on_test_suite_end = fct_junit_logger__on_test_suite_end;
    logger->vtable.on_fctx_start = fct_junit_logger__on_fct_start;
    logger->vtable.on_fctx_end = fct_junit_logger__on_fctx_end;
    logger->vtable.on_delete = fct_junit_logger__on_delete;
    return logger;
}